

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

void ures_appendResPath(UResourceBundle *resB,char *toAdd,int32_t lenToAdd,UErrorCode *status)

{
  int iVar1;
  char *__dest;
  int iVar2;
  
  iVar1 = resB->fResPathLen;
  __dest = resB->fResPath;
  iVar2 = iVar1;
  if (__dest == (char *)0x0) {
    __dest = resB->fResBuf;
    resB->fResPath = __dest;
    resB->fResBuf[0] = '\0';
    iVar2 = 0;
  }
  iVar2 = iVar2 + lenToAdd;
  resB->fResPathLen = iVar2;
  if (0x3e < iVar2) {
    if (__dest == resB->fResBuf) {
      __dest = (char *)uprv_malloc_63((ulong)(iVar2 + 1));
      resB->fResPath = __dest;
      if (__dest == (char *)0x0) goto LAB_002c4e66;
      strcpy(__dest,resB->fResBuf);
    }
    else {
      __dest = (char *)uprv_realloc_63(__dest,(ulong)(iVar2 + 1));
      if (__dest == (char *)0x0) {
LAB_002c4e66:
        *status = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      resB->fResPath = __dest;
    }
  }
  strcpy(__dest + iVar1,toAdd);
  return;
}

Assistant:

static void ures_appendResPath(UResourceBundle *resB, const char* toAdd, int32_t lenToAdd, UErrorCode *status) {
    int32_t resPathLenOrig = resB->fResPathLen;
    if(resB->fResPath == NULL) {
        resB->fResPath = resB->fResBuf;
        *(resB->fResPath) = 0;
        resB->fResPathLen = 0;
    } 
    resB->fResPathLen += lenToAdd;
    if(RES_BUFSIZE <= resB->fResPathLen+1) {
        if(resB->fResPath == resB->fResBuf) {
            resB->fResPath = (char *)uprv_malloc((resB->fResPathLen+1)*sizeof(char));
            /* Check that memory was allocated correctly. */
            if (resB->fResPath == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            uprv_strcpy(resB->fResPath, resB->fResBuf);
        } else {
            char *temp = (char *)uprv_realloc(resB->fResPath, (resB->fResPathLen+1)*sizeof(char));
            /* Check that memory was reallocated correctly. */
            if (temp == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            resB->fResPath = temp;
        }
    }
    uprv_strcpy(resB->fResPath + resPathLenOrig, toAdd);
}